

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.cpp
# Opt level: O2

void __thiscall embree::LineSegments::setVertexAttributeCount(LineSegments *this,uint N)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  BufferView<char> *pBVar3;
  Device *pDVar4;
  BufferView<char> *pBVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  ulong uVar12;
  undefined4 extraout_var;
  size_t i;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  
  uVar16 = (ulong)N;
  uVar14 = (this->vertexAttribs).size_alloced;
  uVar13 = uVar14;
  if ((uVar14 < uVar16) && (uVar12 = uVar14, uVar13 = uVar16, uVar14 != 0)) {
    for (; uVar13 = uVar12, uVar12 < uVar16; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
    }
  }
  uVar12 = (this->vertexAttribs).size_active;
  if (uVar16 < uVar12) {
    lVar15 = uVar16 * 0x38;
    for (uVar14 = uVar16; uVar14 < uVar12; uVar14 = uVar14 + 1) {
      RawBufferView::~RawBufferView
                ((RawBufferView *)
                 ((long)&(((this->vertexAttribs).items)->super_RawBufferView).ptr_ofs + lVar15));
      uVar12 = (this->vertexAttribs).size_active;
      lVar15 = lVar15 + 0x38;
    }
    (this->vertexAttribs).size_active = uVar16;
    uVar14 = (this->vertexAttribs).size_alloced;
    uVar12 = uVar16;
  }
  if (uVar14 == uVar13) {
    lVar15 = uVar12 * 0x38 + 0x30;
    for (; uVar12 < uVar16; uVar12 = uVar12 + 1) {
      pBVar3 = (this->vertexAttribs).items;
      puVar1 = (undefined8 *)((long)pBVar3 + lVar15 + -0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)pBVar3 + lVar15 + -0x30);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)pBVar3 + lVar15 + -0x10) = 0x100000000;
      *(undefined1 *)((long)pBVar3 + lVar15 + -8) = 1;
      *(undefined4 *)((long)pBVar3 + lVar15 + -4) = 0;
      *(undefined8 *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar15) = 0;
      lVar15 = lVar15 + 0x38;
    }
    (this->vertexAttribs).size_active = uVar16;
  }
  else {
    pDVar4 = (this->vertexAttribs).alloc.device;
    pBVar3 = (this->vertexAttribs).items;
    iVar11 = (*(pDVar4->super_State).super_RefCount._vptr_RefCount[8])(pDVar4,uVar13 * 0x38,8,3);
    (this->vertexAttribs).items = (BufferView<char> *)CONCAT44(extraout_var,iVar11);
    lVar15 = 0;
    for (uVar14 = 0; uVar12 = (this->vertexAttribs).size_active, uVar14 < uVar12;
        uVar14 = uVar14 + 1) {
      pBVar5 = (this->vertexAttribs).items;
      puVar1 = (undefined8 *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar15);
      uVar6 = *puVar1;
      uVar7 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pBVar3->super_RawBufferView).stride + lVar15);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pBVar3->super_RawBufferView).format + lVar15);
      uVar10 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pBVar5->super_RawBufferView).format + lVar15);
      *puVar2 = *puVar1;
      puVar2[1] = uVar10;
      puVar1 = (undefined8 *)((long)&(pBVar5->super_RawBufferView).stride + lVar15);
      *puVar1 = uVar8;
      puVar1[1] = uVar9;
      puVar1 = (undefined8 *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar15);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      *(undefined8 *)((long)&(pBVar5->super_RawBufferView).buffer.ptr + lVar15) =
           *(undefined8 *)((long)&(pBVar3->super_RawBufferView).buffer.ptr + lVar15);
      *(undefined8 *)((long)&(pBVar3->super_RawBufferView).buffer.ptr + lVar15) = 0;
      RawBufferView::~RawBufferView
                ((RawBufferView *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar15));
      lVar15 = lVar15 + 0x38;
    }
    lVar15 = uVar12 * 0x38 + 0x30;
    for (; uVar12 < uVar16; uVar12 = uVar12 + 1) {
      pBVar5 = (this->vertexAttribs).items;
      puVar1 = (undefined8 *)((long)pBVar5 + lVar15 + -0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)pBVar5 + lVar15 + -0x30);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)pBVar5 + lVar15 + -0x10) = 0x100000000;
      *(undefined1 *)((long)pBVar5 + lVar15 + -8) = 1;
      *(undefined4 *)((long)pBVar5 + lVar15 + -4) = 0;
      *(undefined8 *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar15) = 0;
      lVar15 = lVar15 + 0x38;
    }
    pDVar4 = (this->vertexAttribs).alloc.device;
    if (pDVar4 != (Device *)0x0) {
      (*(pDVar4->super_State).super_RefCount._vptr_RefCount[9])(pDVar4,pBVar3);
    }
    (this->vertexAttribs).size_active = uVar16;
    (this->vertexAttribs).size_alloced = uVar13;
  }
  Geometry::update(&this->super_Geometry);
  return;
}

Assistant:

void LineSegments::setVertexAttributeCount (unsigned int N)
  {
    vertexAttribs.resize(N);
    Geometry::update();
  }